

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

HRESULT Js::TypedArrayBase::GetBuffer
                  (Var instance,ArrayBuffer **outBuffer,uint32 *outOffset,uint32 *outLength)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  TypedArrayBase *this;
  undefined4 extraout_var;
  ArrayBuffer *pAVar4;
  DataView *this_00;
  ArrayBufferBase *pAVar5;
  undefined4 extraout_var_00;
  DataView *dView;
  ArrayBuffer *buffer;
  TypedArrayBase *typedArrayBase;
  HRESULT hr;
  uint32 *outLength_local;
  uint32 *outOffset_local;
  ArrayBuffer **outBuffer_local;
  Var instance_local;
  
  typedArrayBase._4_4_ = 0;
  bVar1 = VarIs<Js::TypedArrayBase>(instance);
  if (bVar1) {
    this = VarTo<Js::TypedArrayBase>(instance);
    pAVar5 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
    iVar2 = (*(pAVar5->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6e])();
    *outBuffer = (ArrayBuffer *)CONCAT44(extraout_var,iVar2);
    uVar3 = GetByteOffset(this);
    *outOffset = uVar3;
    uVar3 = GetByteLength(this);
    *outLength = uVar3;
  }
  else {
    bVar1 = VarIs<Js::ArrayBuffer>(instance);
    if (bVar1) {
      pAVar4 = VarTo<Js::ArrayBuffer>(instance);
      *outBuffer = pAVar4;
      *outOffset = 0;
      uVar3 = (*(pAVar4->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])();
      *outLength = uVar3;
    }
    else {
      bVar1 = VarIs<Js::DataView>(instance);
      if (bVar1) {
        this_00 = VarTo<Js::DataView>(instance);
        pAVar5 = ArrayBufferParent::GetArrayBuffer(&this_00->super_ArrayBufferParent);
        iVar2 = (*(pAVar5->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6e])();
        *outBuffer = (ArrayBuffer *)CONCAT44(extraout_var_00,iVar2);
        uVar3 = DataView::GetByteOffset(this_00);
        *outOffset = uVar3;
        uVar3 = ArrayObject::GetLength((ArrayObject *)this_00);
        *outLength = uVar3;
      }
      else {
        typedArrayBase._4_4_ = -0x7ff8ffa9;
      }
    }
  }
  return typedArrayBase._4_4_;
}

Assistant:

HRESULT TypedArrayBase::GetBuffer(Var instance, ArrayBuffer** outBuffer, uint32* outOffset, uint32* outLength)
    {
        HRESULT hr = NOERROR;
        if (Js::VarIs<Js::TypedArrayBase>(instance))
        {
            Js::TypedArrayBase* typedArrayBase = Js::VarTo<Js::TypedArrayBase>(instance);
            *outBuffer = typedArrayBase->GetArrayBuffer()->GetAsArrayBuffer();
            *outOffset = typedArrayBase->GetByteOffset();
            *outLength = typedArrayBase->GetByteLength();
        }
        else if (Js::VarIs<Js::ArrayBuffer>(instance))
        {
            Js::ArrayBuffer* buffer = Js::VarTo<Js::ArrayBuffer>(instance);
            *outBuffer = buffer;
            *outOffset = 0;
            *outLength = buffer->GetByteLength();
        }
        else if (Js::VarIs<Js::DataView>(instance))
        {
            Js::DataView* dView = Js::VarTo<Js::DataView>(instance);
            *outBuffer = dView->GetArrayBuffer()->GetAsArrayBuffer();
            *outOffset = dView->GetByteOffset();
            *outLength = dView->GetLength();
        }
        else
        {
            hr = E_INVALIDARG;
        }
        return hr;

    }